

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_list(connectdata *conn)

{
  void *pvVar1;
  char *local_58;
  char *local_50;
  char *mailbox;
  IMAP *imap;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x40) == 0) {
    if (*(long *)((long)pvVar1 + 8) == 0) {
      local_58 = (*Curl_cstrdup)("");
    }
    else {
      local_58 = imap_atom(*(char **)((long)pvVar1 + 8),true);
    }
    if (local_58 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    data._4_4_ = imap_sendf(conn,"LIST \"%s\" *",local_58);
    (*Curl_cfree)(local_58);
  }
  else {
    if (*(long *)((long)pvVar1 + 0x48) == 0) {
      local_50 = "";
    }
    else {
      local_50 = *(char **)((long)pvVar1 + 0x48);
    }
    data._4_4_ = imap_sendf(conn,"%s%s",*(undefined8 *)((long)pvVar1 + 0x40),local_50);
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,IMAP_LIST);
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_perform_list(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = data->req.protop;

  if(imap->custom)
    /* Send the custom request */
    result = imap_sendf(conn, "%s%s", imap->custom,
                        imap->custom_params ? imap->custom_params : "");
  else {
    /* Make sure the mailbox is in the correct atom format if necessary */
    char *mailbox = imap->mailbox ? imap_atom(imap->mailbox, true)
                                  : strdup("");
    if(!mailbox)
      return CURLE_OUT_OF_MEMORY;

    /* Send the LIST command */
    result = imap_sendf(conn, "LIST \"%s\" *", mailbox);

    free(mailbox);
  }

  if(!result)
    state(conn, IMAP_LIST);

  return result;
}